

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

int uv_timer_start(uv_timer_t *handle,uv_timer_cb cb,uint64_t timeout,uint64_t repeat)

{
  uint *puVar1;
  anon_struct_16_2_d918446b_for_timer_heap *heap;
  uv_loop_t *puVar2;
  heap_node *parent;
  bool bVar3;
  uint uVar4;
  uint64_t uVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  uint uVar9;
  anon_struct_16_2_d918446b_for_timer_heap *paVar10;
  
  if (cb == (uv_timer_cb)0x0) {
    return -0x16;
  }
  if ((handle->flags & 4) != 0) {
    uv_timer_stop(handle);
  }
  puVar2 = handle->loop;
  uVar5 = 0xffffffffffffffff;
  if (!CARRY8(timeout,puVar2->time)) {
    uVar5 = timeout + puVar2->time;
  }
  handle->timer_cb = cb;
  handle->timeout = uVar5;
  handle->repeat = repeat;
  uVar5 = puVar2->timer_counter;
  puVar2->timer_counter = uVar5 + 1;
  handle->start_id = uVar5;
  heap = &puVar2->timer_heap;
  handle->heap_node[0] = (void *)0x0;
  handle->heap_node[1] = (void *)0x0;
  handle->heap_node[2] = (void *)0x0;
  uVar4 = (puVar2->timer_heap).nelts + 1;
  if (uVar4 < 2) {
    pvVar8 = heap->min;
    paVar10 = heap;
  }
  else {
    iVar6 = 0;
    uVar7 = 0;
    uVar9 = uVar4;
    do {
      uVar7 = (uVar9 & 1) + uVar7 * 2;
      iVar6 = iVar6 + -1;
      bVar3 = 3 < uVar9;
      paVar10 = heap;
      uVar9 = uVar9 >> 1;
    } while (bVar3);
    do {
      pvVar8 = paVar10->min;
      paVar10 = (anon_struct_16_2_d918446b_for_timer_heap *)((long)pvVar8 + (ulong)(uVar7 & 1) * 8);
      uVar7 = uVar7 >> 1;
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0);
  }
  handle->heap_node[2] = pvVar8;
  paVar10->min = handle->heap_node;
  (puVar2->timer_heap).nelts = uVar4;
  while (parent = (heap_node *)handle->heap_node[2], parent != (heap_node *)0x0) {
    if ((parent[1].left <= (heap_node *)handle->timeout) &&
       ((parent[1].left < (heap_node *)handle->timeout ||
        (parent[1].parent <= (heap_node *)handle->start_id)))) break;
    heap_node_swap((heap *)heap,parent,(heap_node *)handle->heap_node);
  }
  uVar4 = handle->flags;
  if (((uVar4 & 4) == 0) && (handle->flags = uVar4 | 4, (uVar4 & 8) != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 + 1;
  }
  return 0;
}

Assistant:

int uv_timer_start(uv_timer_t* handle,
                   uv_timer_cb cb,
                   uint64_t timeout,
                   uint64_t repeat) {
  uint64_t clamped_timeout;

  if (cb == NULL)
    return UV_EINVAL;

  if (uv__is_active(handle))
    uv_timer_stop(handle);

  clamped_timeout = handle->loop->time + timeout;
  if (clamped_timeout < timeout)
    clamped_timeout = (uint64_t) -1;

  handle->timer_cb = cb;
  handle->timeout = clamped_timeout;
  handle->repeat = repeat;
  /* start_id is the second index to be compared in uv__timer_cmp() */
  handle->start_id = handle->loop->timer_counter++;

  heap_insert(timer_heap(handle->loop),
              (struct heap_node*) &handle->heap_node,
              timer_less_than);
  uv__handle_start(handle);

  return 0;
}